

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int bc_put_atom(BCWriterState *s,JSAtom atom)

{
  BOOL BVar1;
  int iVar2;
  JSAtom in_ESI;
  BCWriterState *in_RDI;
  uint32_t v;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  BVar1 = __JS_AtomIsTaggedInt(in_ESI);
  if (BVar1 == 0) {
    iVar2 = bc_atom_to_idx((BCWriterState *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (uint32_t *)in_RDI,in_ESI);
    if (iVar2 != 0) {
      return -1;
    }
  }
  else {
    __JS_AtomToUInt32(in_ESI);
  }
  bc_put_leb128(in_RDI,in_ESI);
  return 0;
}

Assistant:

static int bc_put_atom(BCWriterState *s, JSAtom atom)
{
    uint32_t v;

    if (__JS_AtomIsTaggedInt(atom)) {
        v = (__JS_AtomToUInt32(atom) << 1) | 1;
    } else {
        if (bc_atom_to_idx(s, &v, atom))
            return -1;
        v <<= 1;
    }
    bc_put_leb128(s, v);
    return 0;
}